

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.cpp
# Opt level: O2

bool __thiscall ArmPoolCommand::Validate(ArmPoolCommand *this)

{
  size_t sVar1;
  ArmPool *pAVar2;
  u64 uVar3;
  u64 uVar4;
  bool bVar5;
  bool bVar6;
  
  pAVar2 = Arm.Pools;
  sVar1 = this->PoolId;
  uVar4 = Arm.Pools[sVar1].RamPos;
  uVar3 = FileManager::getVirtualAddress(g_fileManager);
  bVar5 = uVar4 != uVar3;
  if (bVar5) {
    uVar4 = FileManager::getVirtualAddress(g_fileManager);
    this->RamPos = uVar4;
    pAVar2[sVar1].RamPos = uVar4;
  }
  sVar1 = pAVar2[sVar1].EntryCount;
  bVar6 = sVar1 != this->Size;
  if (bVar6) {
    this->Size = sVar1;
  }
  FileManager::advanceMemory(g_fileManager,sVar1 << 2);
  Arm.CurrentPool = Arm.CurrentPool + 1;
  return bVar6 || bVar5;
}

Assistant:

bool ArmPoolCommand::Validate()
{
	bool Result = false;
	ArmPool& Pool = Arm.GetPool(PoolId);

	if (Pool.GetRamPos() != g_fileManager->getVirtualAddress())
	{
		RamPos = g_fileManager->getVirtualAddress();
		Pool.SetRamPos(RamPos);
		Result = true;
	}
	if (Pool.GetCount() != Size)
	{
		Size = Pool.GetCount();
		Result = true;
	}

	g_fileManager->advanceMemory(Size*4);
	Arm.NextPool();
	return Result;
}